

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_alloc.c
# Opt level: O3

void * lj_alloc_f(void *msp,void *ptr,size_t osize,size_t nsize)

{
  void *pvVar1;
  
  if (nsize == 0) {
    lj_alloc_free(msp,ptr);
    return (void *)0x0;
  }
  if (ptr != (void *)0x0) {
    pvVar1 = lj_alloc_realloc(msp,ptr,nsize);
    return pvVar1;
  }
  pvVar1 = lj_alloc_malloc(msp,nsize);
  return pvVar1;
}

Assistant:

void *lj_alloc_f(void *msp, void *ptr, size_t osize, size_t nsize)
{
  (void)osize;
  if (nsize == 0) {
    return lj_alloc_free(msp, ptr);
  } else if (ptr == NULL) {
    return lj_alloc_malloc(msp, nsize);
  } else {
    return lj_alloc_realloc(msp, ptr, nsize);
  }
}